

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 07_result.cc
# Opt level: O2

result<Foo,_ErrorMsg> * __thiscall
Foo::create_abi_cxx11_(result<Foo,_ErrorMsg> *__return_storage_ptr__,Foo *this,int n)

{
  allocator<char> local_31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if ((int)this < 0x15) {
    *(int *)&(__return_storage_ptr__->
             super_strong_type_base<std::variant<Foo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
             ).
             super_strong_type_payload<std::variant<Foo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
             ._value.
             super__Variant_base<Foo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .super__Move_assign_alias<Foo,_std::__cxx11::basic_string<char>_>.
             super__Copy_assign_alias<Foo,_std::__cxx11::basic_string<char>_>.
             super__Move_ctor_alias<Foo,_std::__cxx11::basic_string<char>_> = (int)this;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->
             super_strong_type_base<std::variant<Foo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
             ).
             super_strong_type_payload<std::variant<Foo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
             ._value.
             super__Variant_base<Foo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .super__Move_assign_alias<Foo,_std::__cxx11::basic_string<char>_>.
             super__Copy_assign_alias<Foo,_std::__cxx11::basic_string<char>_>.
             super__Move_ctor_alias<Foo,_std::__cxx11::basic_string<char>_> + 0x20) = '\0';
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"Too big!",&local_31);
    std::variant<Foo,std::__cxx11::string>::
    variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
              ((variant<Foo,std::__cxx11::string> *)__return_storage_ptr__,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

static ezy::result<Foo, ErrorMsg> create(int n)
    {
      if (n > 20)
      {
        return ErrorMsg{"Too big!"};
      }

      return Foo(n);
    }